

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# switch.cpp
# Opt level: O3

void __thiscall QtMWidgets::Switch::paintEvent(Switch *this,QPaintEvent *param_1)

{
  State SVar1;
  int iVar2;
  uint uVar3;
  SwitchPrivate *pSVar4;
  double dVar5;
  long *plVar6;
  int iVar7;
  QBrush *this_00;
  QColor QVar8;
  QPainter p;
  QColor lightAlphaColor;
  QPainterPath glow;
  QColor lightColor;
  QPainterPath rect;
  QLinearGradient g;
  QColor borderColor;
  QStyleOption opt;
  undefined1 local_110 [8];
  qreal local_108;
  qreal qStack_100;
  undefined1 local_f0 [16];
  qreal qStack_e0;
  undefined1 local_d8 [16];
  qreal local_c8;
  undefined8 uStack_c0;
  double local_b8;
  double local_b0;
  QColor local_68;
  QStyleOption local_58 [16];
  uint local_48;
  int local_40;
  undefined1 local_30 [24];
  
  QStyleOption::QStyleOption(local_58,1,0);
  QStyleOption::initFrom((QWidget *)local_58);
  plVar6 = (long *)QPalette::brush((ColorGroup)local_30,Dark);
  local_68._0_8_ = *(undefined8 *)(*plVar6 + 8);
  local_68._8_8_ = *(undefined8 *)(*plVar6 + 0x10);
  plVar6 = (long *)QPalette::brush((ColorGroup)local_30,Dark);
  local_f0._8_8_ = *(qreal *)(*plVar6 + 8);
  qStack_e0 = *(qreal *)(*plVar6 + 0x10);
  QPainter::QPainter((QPainter *)local_110,(QPaintDevice *)&this->field_0x10);
  local_c8 = 1.0;
  uStack_c0 = 1.0;
  QPainter::translate((QPointF *)local_110);
  QPainter::setRenderHint((RenderHint)local_110,true);
  pSVar4 = (this->d).d;
  SVar1 = pSVar4->state;
  if (SVar1 < NotAcceptedCheck) {
    local_108 = 0.0;
    qStack_100 = 0.0;
    local_d8._0_4_ = 0;
    local_d8._4_4_ = 0;
    local_d8._8_4_ = 0;
    local_d8._12_4_ = 0x3ff00000;
    QLinearGradient::QLinearGradient
              ((QLinearGradient *)&local_c8,(QPointF *)&local_108,(QPointF *)local_d8);
    QGradient::setCoordinateMode((CoordinateMode)&local_c8);
    QVar8 = darkerColor((QColor *)(local_f0 + 8),0x4b);
    local_108 = QVar8._0_8_;
    qStack_100._0_6_ = QVar8.ct._4_6_;
    QGradient::setColorAt(0.0,(QColor *)&local_c8);
    QVar8 = darkerColor((QColor *)(local_f0 + 8),0x19);
    local_108 = QVar8._0_8_;
    qStack_100._0_6_ = QVar8.ct._4_6_;
    QGradient::setColorAt(0.1,(QColor *)&local_c8);
    QVar8 = darkerColor((QColor *)(local_f0 + 8),10);
    local_108 = QVar8._0_8_;
    qStack_100._0_6_ = QVar8.ct._4_6_;
    QGradient::setColorAt(1.0,(QColor *)&local_c8);
    QBrush::QBrush((QBrush *)&local_108,(QGradient *)&local_c8);
    QPainter::setBrush((QBrush *)local_110);
    QBrush::~QBrush((QBrush *)&local_108);
    QLinearGradient::~QLinearGradient((QLinearGradient *)&local_c8);
  }
  else {
    if (SVar1 == NotAcceptedCheck) {
      QVar8 = darkerColor(&pSVar4->onColor,0x32);
      local_c8 = QVar8._0_8_;
      uStack_c0._0_6_ = QVar8.ct._4_6_;
      QBrush::QBrush((QBrush *)&local_108,(QColor *)&local_c8,SolidPattern);
      QPainter::setBrush((QBrush *)local_110);
      this_00 = (QBrush *)&local_108;
    }
    else {
      if (SVar1 != AcceptedCheck) goto LAB_0016cb6d;
      QBrush::QBrush((QBrush *)&local_c8,&pSVar4->onColor,SolidPattern);
      QPainter::setBrush((QBrush *)local_110);
      this_00 = (QBrush *)&local_c8;
    }
    QBrush::~QBrush(this_00);
  }
LAB_0016cb6d:
  QPainter::setPen((QColor *)local_110);
  QPainterPath::QPainterPath((QPainterPath *)local_d8);
  local_b8 = (double)(int)(~local_48 + local_40);
  iVar2 = ((this->d).d)->radius;
  local_b0 = (double)(iVar2 * 2);
  dVar5 = (double)iVar2;
  local_c8 = 0.0;
  uStack_c0 = 0.0;
  QPainterPath::addRoundedRect((QRectF *)local_d8,dVar5,dVar5,(SizeMode)&local_c8);
  QPainter::drawPath((QPainterPath *)local_110);
  SwitchPrivate::drawText
            ((this->d).d,(QPainter *)local_110,local_58,(QColor *)(local_f0 + 8),&local_68);
  local_108 = (qreal)local_f0._8_8_;
  qStack_100 = qStack_e0;
  QColor::setAlpha((int)&local_108);
  QPainter::setPen((PenStyle)local_110);
  QBrush::QBrush((QBrush *)&local_c8,(QColor *)&local_108,SolidPattern);
  QPainter::setBrush((QBrush *)local_110);
  QBrush::~QBrush((QBrush *)&local_c8);
  QPainterPath::QPainterPath((QPainterPath *)local_f0);
  iVar2 = ((this->d).d)->radius;
  iVar7 = iVar2 + 3;
  if (-1 < iVar2) {
    iVar7 = iVar2;
  }
  local_c8 = (qreal)(iVar7 >> 2);
  uStack_c0 = (double)iVar2;
  local_b8 = (double)(int)(((local_40 - iVar2 / 2) - local_48) + 1);
  local_b0 = (double)(iVar2 * 2);
  dVar5 = (double)(iVar2 / 2);
  QPainterPath::addRoundedRect((QRectF *)local_f0,dVar5,dVar5,(SizeMode)&local_c8);
  QPainterPath::intersected((QPainterPath *)&local_c8);
  QPainter::drawPath((QPainterPath *)local_110);
  QPainterPath::~QPainterPath((QPainterPath *)&local_c8);
  pSVar4 = (this->d).d;
  iVar2 = pSVar4->radius;
  uVar3 = pSVar4->offset;
  local_c8 = (qreal)(ulong)uVar3;
  uStack_c0 = (double)CONCAT44(iVar2 * 2 + -1,(uVar3 - 1) + iVar2 * 2);
  drawSliderHandle((QPainter *)local_110,(QRect *)&local_c8,iVar2,iVar2,&local_68,
                   (QColor *)(local_f0 + 8));
  QPainterPath::~QPainterPath((QPainterPath *)local_f0);
  QPainterPath::~QPainterPath((QPainterPath *)local_d8);
  QPainter::~QPainter((QPainter *)local_110);
  QStyleOption::~QStyleOption(local_58);
  return;
}

Assistant:

void
Switch::paintEvent( QPaintEvent * )
{
	QStyleOption opt;
	opt.initFrom( this );

	QColor borderColor = opt.palette.color( QPalette::Shadow );
	QColor lightColor = opt.palette.color( QPalette::Base );

	QPainter p( this );
	p.translate( 1.0, 1.0 );
	p.setRenderHint( QPainter::Antialiasing );

	switch( d->state )
	{
		case NotAcceptedUncheck :
		case AcceptedUncheck :
		{
			QLinearGradient g( QPointF( 0.0, 0.0 ), QPointF( 0.0, 1.0 ) );
			g.setCoordinateMode( QGradient::ObjectBoundingMode );
			g.setColorAt( 0.0, darkerColor( lightColor, 75 ) );
			g.setColorAt( 0.1, darkerColor( lightColor, 25 ) );
			g.setColorAt( 1.0, darkerColor( lightColor, 10 ) );

			p.setBrush( g );
		}
		break;

		case NotAcceptedCheck :
			p.setBrush( darkerColor( d->onColor, 50 ) );
		break;

		case AcceptedCheck :
			p.setBrush( d->onColor );
		break;
	}

	p.setPen( borderColor );

	QPainterPath rect;
	rect.addRoundedRect( 0, 0, opt.rect.width() - 2, d->radius * 2,
		d->radius, d->radius );

	p.drawPath( rect );

	d->drawText( &p, opt, lightColor, borderColor );

	QColor lightAlphaColor = lightColor;
	lightAlphaColor.setAlpha( 50 );

	p.setPen( Qt::NoPen );
	p.setBrush( lightAlphaColor );

	QPainterPath glow;
	glow.addRoundedRect( d->radius / 4, d->radius,
		opt.rect.width() - d->radius / 2, d->radius * 2,
		d->radius / 2, d->radius / 2 );

	p.drawPath( rect.intersected( glow ) );

	drawSliderHandle( &p, QRect( d->offset, 0,
		d->radius * 2, d->radius * 2 ),
			d->radius, d->radius, borderColor, lightColor );
}